

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O1

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:731:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  ostringstream *this;
  undefined8 this_00;
  OutputWorker *this_01;
  ErrorResult *pEVar2;
  long lVar3;
  type handler;
  ptr p;
  Result local_1e0;
  undefined1 local_1d8 [16];
  error_category *local_1c8;
  ptr local_1b8;
  undefined1 local_1a0 [392];
  
  local_1c8 = *(error_category **)&base[1].task_result_;
  local_1b8.h = (type *)local_1d8;
  local_1d8._0_8_ = base[1].next_;
  local_1d8._8_8_ = base[1].func_;
  local_1b8.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:731:27)>
                 *)base;
  local_1b8.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:731:27)>
                 *)base;
  ptr::reset(&local_1b8);
  this_00 = local_1d8._0_8_;
  if (owner != (void *)0x0) {
    if (((((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
            *)(local_1d8._0_8_ + 0xc7d0))->_M_t).
         super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
         ._M_t.
         super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
         .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl ==
         (HostnameResolverState *)0x0) ||
       (((((atomic<bool> *)(local_1d8._0_8_ + 0xc7e0))->_M_base)._M_i & 1U) != 0)) {
      (**(code **)(*(long *)local_1c8 + 0x20))(local_1a0,local_1c8,local_1d8._8_8_ & 0xffffffff);
      lVar3 = (long)(int)local_1d8._8_4_;
      pEVar2 = (ErrorResult *)operator_new(0x38);
      pEVar2->Source = "Connection::OnICMPError";
      (pEVar2->Description)._M_dataplus._M_p = (pointer)&(pEVar2->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar2->Description,local_1a0._0_8_,
                 (char *)(local_1a0._0_8_ + CONCAT44(local_1a0._12_4_,local_1a0._8_4_)));
      pEVar2->Type = Asio;
      pEVar2->Code = lVar3;
      local_1e0.Error = pEVar2;
      tonk::RefCounter::StartShutdown(&((IConnection *)this_00)->SelfRefCount,6,&local_1e0);
      tonk::Result::~Result(&local_1e0);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_);
      }
    }
    else {
      if ((int)((Channel *)(local_1d8._0_8_ + 0x110))->ChannelMinLevel < 2) {
        local_1a0._0_8_ = ((Channel *)(local_1d8._0_8_ + 0x110))->ChannelName;
        this = (ostringstream *)(local_1a0 + 0x10);
        local_1a0._8_4_ = Debug;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(((Channel *)(this_00 + 0x110))->Prefix)._M_dataplus._M_p,
                   (((Channel *)(this_00 + 0x110))->Prefix)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Selecting next server to connect to",0x23);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      tonk::Connection::startConnectingToNextAddress((Connection *)this_00);
    }
    LOCK();
    paVar1 = &(((IConnection *)this_00)->SelfRefCount).RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  ptr::reset(&local_1b8);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }